

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3DbSpanDup(sqlite3 *db,char *zStart,char *zEnd)

{
  char *pcVar1;
  bool bVar2;
  int local_24;
  int n;
  char *zEnd_local;
  char *zStart_local;
  sqlite3 *db_local;
  
  zEnd_local = zStart;
  while ((""[(byte)*zEnd_local] & 1) != 0) {
    zEnd_local = zEnd_local + 1;
  }
  local_24 = (int)zEnd - (int)zEnd_local;
  while( true ) {
    bVar2 = false;
    if (0 < local_24) {
      bVar2 = (""[(byte)zEnd_local[local_24 + -1]] & 1) != 0;
    }
    if (!bVar2) break;
    local_24 = local_24 + -1;
  }
  pcVar1 = sqlite3DbStrNDup(db,zEnd_local,(long)local_24);
  return pcVar1;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbSpanDup(sqlite3 *db, const char *zStart, const char *zEnd){
  int n;
  while( sqlite3Isspace(zStart[0]) ) zStart++;
  n = (int)(zEnd - zStart);
  while( ALWAYS(n>0) && sqlite3Isspace(zStart[n-1]) ) n--;
  return sqlite3DbStrNDup(db, zStart, n);
}